

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getDualRaySparse(Highs *this,bool *has_dual_ray,HVector *row_ep_buffer)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = (this->ekk_instance_).dual_ray_record_.index != -1;
  *has_dual_ray = bVar2;
  if (bVar2) {
    HEkk::setNlaPointersForLpAndScale(&this->ekk_instance_,&(this->model_).lp_);
    HVectorBase<double>::clear(row_ep_buffer);
    row_ep_buffer->count = 1;
    row_ep_buffer->packFlag = true;
    iVar1 = (this->ekk_instance_).dual_ray_record_.index;
    *(row_ep_buffer->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar1;
    (row_ep_buffer->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar1] = (double)(this->ekk_instance_).dual_ray_record_.sign;
    HEkk::btran(&this->ekk_instance_,row_ep_buffer,(this->ekk_instance_).info_.row_ep_density);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::getDualRaySparse(bool& has_dual_ray,
                                    HVector& row_ep_buffer) {
  has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
  if (has_dual_ray) {
    ekk_instance_.setNlaPointersForLpAndScale(model_.lp_);
    row_ep_buffer.clear();
    row_ep_buffer.count = 1;
    row_ep_buffer.packFlag = true;
    HighsInt iRow = ekk_instance_.dual_ray_record_.index;
    row_ep_buffer.index[0] = iRow;
    row_ep_buffer.array[iRow] = ekk_instance_.dual_ray_record_.sign;

    ekk_instance_.btran(row_ep_buffer, ekk_instance_.info_.row_ep_density);
  }

  return HighsStatus::kOk;
}